

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFFileInput.cpp
# Opt level: O2

EStatusCode __thiscall
CFFFileInput::ReadDict
          (CFFFileInput *this,unsigned_long inReadAmount,UShortToDictOperandListMap *outDict)

{
  bool bVar1;
  EStatusCode EVar2;
  LongFilePositionType LVar3;
  LongFilePositionType LVar4;
  CFFPrimitiveReader *this_00;
  Byte aBuffer;
  unsigned_short anOperator;
  DictOperandList operands;
  DictOperand anOperand;
  Byte local_8b;
  unsigned_short local_8a;
  _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
  *local_88;
  pair<const_unsigned_short,_std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>_>
  local_80;
  _List_base<DictOperand,_std::allocator<DictOperand>_> local_60;
  DictOperand local_48;
  
  this_00 = &this->mPrimitivesReader;
  local_88 = (_Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
              *)outDict;
  LVar3 = CFFPrimitiveReader::GetCurrentPosition(this_00);
  local_60._M_impl._M_node._M_size = 0;
  local_60._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_60;
  local_60._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_60;
  while( true ) {
    LVar4 = CFFPrimitiveReader::GetCurrentPosition(this_00);
    if ((long)inReadAmount <= LVar4 - LVar3) break;
    EVar2 = CFFPrimitiveReader::ReadByte(this_00,&local_8b);
    if (EVar2 != eSuccess) goto LAB_00172564;
    bVar1 = CFFPrimitiveReader::IsDictOperator(this_00,local_8b);
    if (bVar1) {
      EVar2 = CFFPrimitiveReader::ReadDictOperator(this_00,local_8b,&local_8a);
      if (EVar2 != eSuccess) goto LAB_00172564;
      local_80.first = local_8a;
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::list
                (&local_80.second,(list<DictOperand,_std::allocator<DictOperand>_> *)&local_60);
      std::
      _Rb_tree<unsigned_short,std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>,std::_Select1st<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>,std::less<unsigned_short>,std::allocator<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>>
      ::
      _M_insert_unique<std::pair<unsigned_short_const,std::__cxx11::list<DictOperand,std::allocator<DictOperand>>>>
                (local_88,&local_80);
      std::__cxx11::_List_base<DictOperand,_std::allocator<DictOperand>_>::_M_clear
                (&local_80.second.super__List_base<DictOperand,_std::allocator<DictOperand>_>);
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::clear
                ((list<DictOperand,_std::allocator<DictOperand>_> *)&local_60);
    }
    else {
      EVar2 = CFFPrimitiveReader::ReadDictOperand(this_00,local_8b,&local_48);
      if (EVar2 != eSuccess) goto LAB_00172564;
      std::__cxx11::list<DictOperand,_std::allocator<DictOperand>_>::push_back
                ((list<DictOperand,_std::allocator<DictOperand>_> *)&local_60,&local_48);
    }
  }
  EVar2 = eSuccess;
LAB_00172564:
  std::__cxx11::_List_base<DictOperand,_std::allocator<DictOperand>_>::_M_clear(&local_60);
  return EVar2;
}

Assistant:

EStatusCode CFFFileInput::ReadDict(unsigned long inReadAmount,UShortToDictOperandListMap& outDict)
{
	LongFilePositionType dictStartPosition = mPrimitivesReader.GetCurrentPosition();
	DictOperandList operands;
	EStatusCode status = PDFHummus::eSuccess;
	unsigned short anOperator;
	DictOperand anOperand;
	Byte aBuffer;

	while(PDFHummus::eSuccess == status && 
			(mPrimitivesReader.GetCurrentPosition() - dictStartPosition < (long long)inReadAmount))
	{
		status = mPrimitivesReader.ReadByte(aBuffer);
		if(status != PDFHummus::eSuccess)
			break;
		if(mPrimitivesReader.IsDictOperator(aBuffer))
		{ // operator
			status = mPrimitivesReader.ReadDictOperator(aBuffer,anOperator);
			if(status != PDFHummus::eSuccess)
				break;
			outDict.insert(
				UShortToDictOperandListMap::value_type(anOperator,operands));
			operands.clear();
		}
		else // operand
		{
			status = mPrimitivesReader.ReadDictOperand(aBuffer,anOperand);
			if(status != PDFHummus::eSuccess)
				break;
			operands.push_back(anOperand);
		}
	}

	return status;
}